

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_time.cc
# Opt level: O0

void __thiscall CSocekt::AddToTimerQueue(CSocekt *this,lp_connection_t pConn)

{
  long *plVar1;
  time_t tVar2;
  CSocekt *this_00;
  long in_RSI;
  long in_RDI;
  pair<long,__STRUC_MSG_HEADER_*> pVar3;
  LPSTRUC_MSG_HEADER tmpMsgHeader;
  MutexLockGuard lock;
  time_t futtime;
  CMemory *p_memory;
  MutexLock *in_stack_ffffffffffffff68;
  CMemory *in_stack_ffffffffffffff70;
  
  CMemory::GetInstance();
  time((time_t *)0x0);
  muduo::MutexLockGuard::MutexLockGuard
            ((MutexLockGuard *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  plVar1 = (long *)CMemory::AllocMemory
                             (in_stack_ffffffffffffff70,
                              (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                              SUB81((ulong)in_stack_ffffffffffffff68 >> 0x18,0));
  *plVar1 = in_RSI;
  plVar1[1] = *(long *)(in_RSI + 0x20);
  pVar3 = std::make_pair<long&,_STRUC_MSG_HEADER*&>
                    ((long *)in_stack_ffffffffffffff70,
                     (_STRUC_MSG_HEADER **)in_stack_ffffffffffffff68);
  this_00 = (CSocekt *)pVar3.second;
  std::
  multimap<long,_STRUC_MSG_HEADER*,std::less<long>,std::allocator<std::pair<long_const,_STRUC_MSG_HEADER*>>>
  ::insert<std::pair<long,_STRUC_MSG_HEADER*>>
            ((multimap<long,__STRUC_MSG_HEADER_*,_std::less<long>,_std::allocator<std::pair<const_long,__STRUC_MSG_HEADER_*>_>_>
              *)in_stack_ffffffffffffff68,(pair<long,__STRUC_MSG_HEADER_*> *)0x143187);
  *(long *)(in_RDI + 0x1a68) = *(long *)(in_RDI + 0x1a68) + 1;
  tVar2 = GetEarliestTime(this_00);
  *(time_t *)(in_RDI + 0x1a70) = tVar2;
  muduo::MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x1431d3);
  return;
}

Assistant:

void CSocekt::AddToTimerQueue(lp_connection_t pConn)
{
    CMemory *p_memory = CMemory::GetInstance();

    time_t futtime = time(NULL);  //记录当前时间
    futtime += m_iWaitTime;  //20秒之后的时间

    muduo::MutexLockGuard lock(m_timequeueMutex); //互斥，因为要操作m_timeQueuemap了
    LPSTRUC_MSG_HEADER tmpMsgHeader = (LPSTRUC_MSG_HEADER)p_memory->AllocMemory(m_iLenMsgHeader,false);
    tmpMsgHeader->pConn = pConn;
    tmpMsgHeader->iCurrsequence = pConn->iCurrsequence;
    m_timerQueuemap.insert(std::make_pair(futtime,tmpMsgHeader)); //按键 自动排序 小->大
    m_cur_size_++;  //计时队列尺寸+1
    m_timer_value_ = GetEarliestTime(); //计时队列头部时间值保存到m_timer_value_里
      
}